

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-env-vars.c
# Opt level: O0

int run_test_env_vars(void)

{
  int iVar1;
  size_t sVar2;
  long local_50;
  uv_env_item_t *envitems;
  int local_40;
  int found_win_special;
  int found;
  int envcount;
  int r;
  int i;
  size_t size;
  char buf [10];
  char *name2;
  char *name;
  
  buf._2_8_ = anon_var_dwarf_10d14;
  found = uv_os_setenv(0,"foo");
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x26,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_setenv("UV_TEST_FOO",0);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x28,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_setenv(0);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x2a,"r == UV_EINVAL");
    abort();
  }
  _r = 10;
  found = uv_os_getenv(0,(long)&size + 6,&r);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x2f,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_getenv("UV_TEST_FOO",0,&r);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x31,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,0);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x33,"r == UV_EINVAL");
    abort();
  }
  _r = 0;
  found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,&r);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x36,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_unsetenv(0);
  if (found != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x3a,"r == UV_EINVAL");
    abort();
  }
  found = uv_os_setenv("UV_TEST_FOO","123456789");
  if (found != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x3e,"r == 0");
    abort();
  }
  _r = 10;
  size._6_1_ = 0;
  found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,&r);
  if (found != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x44,"r == 0");
    abort();
  }
  iVar1 = strcmp((char *)((long)&size + 6),"123456789");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x45,"strcmp(buf, \"123456789\") == 0");
    abort();
  }
  if (_r != 9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x46,"size == BUF_SIZE - 1");
    abort();
  }
  _r = 9;
  size._6_1_ = 0;
  found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,&r);
  if (found != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x4c,"r == UV_ENOBUFS");
    abort();
  }
  if (_r != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x4d,"size == BUF_SIZE");
    abort();
  }
  found = uv_os_unsetenv("UV_TEST_FOO");
  if (found != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x51,"r == 0");
    abort();
  }
  found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,&r);
  if (found == -2) {
    found = uv_os_unsetenv("UV_TEST_FOO");
    if (found != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x59,"r == 0");
      abort();
    }
    found = uv_os_setenv("UV_TEST_FOO","");
    if (found != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x5d,"r == 0");
      abort();
    }
    _r = 10;
    found = uv_os_getenv("UV_TEST_FOO",(long)&size + 6,&r);
    if (found != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x60,"r == 0");
      abort();
    }
    if (_r != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x61,"size == 0");
      abort();
    }
    sVar2 = strlen((char *)((long)&size + 6));
    if (sVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x62,"strlen(buf) == 0");
      abort();
    }
    found = uv_os_setenv("UV_TEST_FOO","123456789");
    if (found != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x66,"r == 0");
      abort();
    }
    found = uv_os_setenv(buf._2_8_,"");
    if (found != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x68,"r == 0");
      abort();
    }
    found = uv_os_environ(&local_50,&found_win_special);
    if (found == 0) {
      if (found_win_special < 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
                ,0x72,"envcount > 0");
        abort();
      }
      local_40 = 0;
      envitems._4_4_ = 0;
      found = 0;
      for (envcount = 0; envcount < found_win_special; envcount = envcount + 1) {
        iVar1 = strcmp(*(char **)(local_50 + (long)envcount * 0x10),"UV_TEST_FOO");
        if (iVar1 == 0) {
          local_40 = local_40 + 1;
          iVar1 = strcmp(*(char **)(local_50 + (long)envcount * 0x10 + 8),"123456789");
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
                    ,0x7b,"strcmp(envitems[i].value, \"123456789\") == 0");
            abort();
          }
        }
        else {
          iVar1 = strcmp(*(char **)(local_50 + (long)envcount * 0x10),(char *)buf._2_8_);
          if (iVar1 == 0) {
            local_40 = local_40 + 1;
            sVar2 = strlen(*(char **)(local_50 + (long)envcount * 0x10 + 8));
            if (sVar2 != 0) {
              fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
                      ,0x7e,"strlen(envitems[i].value) == 0");
              abort();
            }
          }
          else if (**(char **)(local_50 + (long)envcount * 0x10) == '=') {
            envitems._4_4_ = envitems._4_4_ + 1;
          }
        }
      }
      if (local_40 != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
                ,0x84,"found == 2");
        abort();
      }
      uv_os_free_environ(local_50,found_win_special);
      found = uv_os_unsetenv("UV_TEST_FOO");
      if (found != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
                ,0x8c,"r == 0");
        abort();
      }
      found = uv_os_unsetenv(buf._2_8_);
      if (found == 0) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
              ,0x8f,"r == 0");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
            ,0x71,"r == 0");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
          ,0x55,"r == UV_ENOENT");
  abort();
}

Assistant:

TEST_IMPL(env_vars) {
  const char* name = "UV_TEST_FOO";
  const char* name2 = "UV_TEST_FOO2";
  char buf[BUF_SIZE];
  size_t size;
  int i, r, envcount, found, found_win_special;
  uv_env_item_t* envitems;

  /* Reject invalid inputs when setting an environment variable */
  r = uv_os_setenv(NULL, "foo");
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(name, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when retrieving an environment variable */
  size = BUF_SIZE;
  r = uv_os_getenv(NULL, buf, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when deleting an environment variable */
  r = uv_os_unsetenv(NULL);
  ASSERT(r == UV_EINVAL);

  /* Successfully set an environment variable */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);

  /* Successfully read an environment variable */
  size = BUF_SIZE;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(strcmp(buf, "123456789") == 0);
  ASSERT(size == BUF_SIZE - 1);

  /* Return UV_ENOBUFS if the buffer cannot hold the environment variable */
  size = BUF_SIZE - 1;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(size == BUF_SIZE);

  /* Successfully delete an environment variable */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Return UV_ENOENT retrieving an environment variable that does not exist */
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOENT);

  /* Successfully delete an environment variable that does not exist */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Setting an environment variable to the empty string does not delete it. */
  r = uv_os_setenv(name, "");
  ASSERT(r == 0);
  size = BUF_SIZE;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(strlen(buf) == 0);

  /* Check getting all env variables. */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);
  r = uv_os_setenv(name2, "");
  ASSERT(r == 0);
#ifdef _WIN32
  /* Create a special environment variable on Windows in case there are no
     naturally occurring ones. */
  r = uv_os_setenv("=Z:", "\\");
  ASSERT(r == 0);
#endif

  r = uv_os_environ(&envitems, &envcount);
  ASSERT(r == 0);
  ASSERT(envcount > 0);

  found = 0;
  found_win_special = 0;

  for (i = 0; i < envcount; i++) {
    /* printf("Env: %s = %s\n", envitems[i].name, envitems[i].value); */
    if (strcmp(envitems[i].name, name) == 0) {
      found++;
      ASSERT(strcmp(envitems[i].value, "123456789") == 0);
    } else if (strcmp(envitems[i].name, name2) == 0) {
      found++;
      ASSERT(strlen(envitems[i].value) == 0);
    } else if (envitems[i].name[0] == '=') {
      found_win_special++;
    }
  }

  ASSERT(found == 2);
#ifdef _WIN32
  ASSERT(found_win_special > 0);
#endif

  uv_os_free_environ(envitems, envcount);

  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  r = uv_os_unsetenv(name2);
  ASSERT(r == 0);

  return 0;
}